

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int __thiscall doctest::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  char *pcVar2;
  String *other_local;
  String *this_local;
  
  bVar1 = isOnStack((String *)dst);
  if (bVar1) {
    (this->field_0).data.ptr = *(char **)dst;
    *(undefined8 *)((long)&this->field_0 + 8) = *(undefined8 *)(dst + 8);
    *(undefined8 *)((long)&this->field_0 + 0x10) = *(undefined8 *)(dst + 0x10);
  }
  else {
    setOnHeap(this);
    (this->field_0).data.size = *(uint *)(dst + 8);
    (this->field_0).data.capacity = (this->field_0).data.size + 1;
    pcVar2 = (char *)operator_new__((ulong)(this->field_0).data.capacity);
    (this->field_0).data.ptr = pcVar2;
    this = (String *)
           memcpy((this->field_0).data.ptr,*(void **)dst,(ulong)((this->field_0).data.size + 1));
  }
  return (int)this;
}

Assistant:

void String::copy(const String& other) {
    using namespace std;
    if(other.isOnStack()) {
        memcpy(buf, other.buf, len);
    } else {
        setOnHeap();
        data.size     = other.data.size;
        data.capacity = data.size + 1;
        data.ptr      = new char[data.capacity];
        memcpy(data.ptr, other.data.ptr, data.size + 1);
    }
}